

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall
TPZEqnArray<double>::EqnBackward(TPZEqnArray<double> *this,TPZFMatrix<double> *U,DecomposeType dec)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  if (this->fSymmetric == EIsNonSymmetric) {
    if (1 < (long)this->fNumEq) {
      lVar6 = (long)this->fNumEq;
      do {
        piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
        iVar1 = piVar3[lVar6 + -2];
        lVar5 = (long)iVar1;
        iVar2 = piVar3[lVar6 + -1];
        dVar9 = 0.0;
        if (iVar1 + 1 < iVar2) {
          lVar8 = lVar5;
          do {
            lVar7 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                          [lVar8 + 1];
            if (((lVar7 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7)) ||
               ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dVar9 = dVar9 - U->fElem[lVar7] *
                            (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>.
                            fStore[lVar8 + 1];
            lVar8 = lVar8 + 1;
          } while (iVar2 + -1 != (int)lVar8);
        }
        lVar8 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar5];
        if (((lVar8 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
           ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        U->fElem[lVar8] = dVar9 + U->fElem[lVar8];
        if ((dec & ~ELUPivot) == ELU) {
          lVar8 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar5]
          ;
          if (((lVar8 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
             ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          U->fElem[lVar8] =
               U->fElem[lVar8] /
               (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>.fStore[lVar5]
          ;
        }
        bVar4 = 3 < lVar6;
        lVar6 = lVar6 + -2;
      } while (bVar4);
    }
  }
  else if ((this->fSymmetric == EIsSymmetric) &&
          (lVar6 = (long)this->fNumEq, 0 < (long)this->fNumEq)) {
    do {
      piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      iVar1 = piVar3[lVar6 + -1];
      lVar5 = (long)iVar1;
      iVar2 = piVar3[lVar6];
      dVar9 = 0.0;
      if (iVar1 + 1 < iVar2) {
        lVar8 = lVar5;
        do {
          lVar7 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                        [lVar8 + 1];
          if (((lVar7 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar7)) ||
             ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar9 = dVar9 - U->fElem[lVar7] *
                          (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>.
                          fStore[lVar8 + 1];
          lVar8 = lVar8 + 1;
        } while (iVar2 + -1 != (int)lVar8);
      }
      lVar8 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar5];
      if (((lVar8 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
         ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      U->fElem[lVar8] = dVar9 + U->fElem[lVar8];
      if (dec == ECholesky) {
        lVar8 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar5];
        if (((lVar8 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
           ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        U->fElem[lVar8] =
             U->fElem[lVar8] /
             (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>.fStore[lVar5];
      }
      bVar4 = 1 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}